

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O3

matd_t * matd_create(int rows,int cols)

{
  matd_t *pmVar1;
  
  if (rows < 0) {
    __assert_fail("rows >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x2f,"matd_t *matd_create(int, int)");
  }
  if (-1 < cols) {
    if (rows == 0 || cols == 0) {
      pmVar1 = (matd_t *)calloc(1,0x10);
      return pmVar1;
    }
    pmVar1 = (matd_t *)calloc(1,(ulong)(uint)(cols * rows) * 8 + 8);
    pmVar1->nrows = rows;
    pmVar1->ncols = cols;
    return pmVar1;
  }
  __assert_fail("cols >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x30,"matd_t *matd_create(int, int)");
}

Assistant:

matd_t *matd_create(int rows, int cols)
{
    assert(rows >= 0);
    assert(cols >= 0);

    if (rows == 0 || cols == 0)
        return matd_create_scalar(0);

    matd_t *m = calloc(1, sizeof(matd_t) + (rows*cols*sizeof(double)));
    m->nrows = rows;
    m->ncols = cols;

    return m;
}